

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_coding.cc
# Opt level: O0

void anon_unknown.dwarf_838f::Free(Node *node)

{
  Node *in_RDI;
  Node *in_stack_fffffffffffffff0;
  
  if (in_RDI != (Node *)0x0) {
    Node::GetLeft(in_RDI);
    Free(in_stack_fffffffffffffff0);
    Node::GetRight(in_RDI);
    Free(in_stack_fffffffffffffff0);
    if (in_RDI != (Node *)0x0) {
      (*in_RDI->_vptr_Node[1])();
    }
  }
  return;
}

Assistant:

void Free(const Node* node) {
  if (NULL == node) return;
  Free(node->GetLeft());
  Free(node->GetRight());
  delete node;
}